

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.cpp
# Opt level: O0

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  StatsAccumulator *in_stack_ffffffffffffffe8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  
  operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void FreeBufferCaches() {
    LOG_VERBOSE("int buffer bytes: %d", intBufferCache->BytesUsed());
    meshIndexBytes += intBufferCache->BytesUsed();
    intBufferCache->Clear();

    LOG_VERBOSE("p bytes: %d", point3BufferCache->BytesUsed());
    meshPositionBytes += point3BufferCache->BytesUsed();
    point3BufferCache->Clear();

    LOG_VERBOSE("n bytes: %d", normal3BufferCache->BytesUsed());
    meshNormalBytes += normal3BufferCache->BytesUsed();
    normal3BufferCache->Clear();

    LOG_VERBOSE("uv bytes: %d", point2BufferCache->BytesUsed());
    meshUVBytes += point2BufferCache->BytesUsed();
    point2BufferCache->Clear();

    LOG_VERBOSE("s bytes: %d", vector3BufferCache->BytesUsed());
    meshTangentBytes += vector3BufferCache->BytesUsed();
    vector3BufferCache->Clear();
}